

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,true,false>
               (interval_t *ldata,date_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 left;
  undefined4 left_00;
  undefined4 left_01;
  unsigned_long *puVar1;
  int64_t iVar2;
  timestamp_t tVar3;
  ulong uVar4;
  ulong uVar5;
  timestamp_t *ptVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      left_01 = ldata->months;
      iVar2 = ldata->micros;
      iVar8 = 0;
      ptVar6 = (timestamp_t *)count;
      do {
        right_01.micros = (int64_t)ptVar6;
        right_01._0_8_ = iVar2;
        tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)(uint)rdata[iVar8].days,(date_t)left_01,right_01);
        result_data[iVar8].value = tVar3.value;
        iVar8 = iVar8 + 1;
        ptVar6 = result_data;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[uVar5];
      }
      uVar11 = uVar4 + 0x40;
      if (count <= uVar4 + 0x40) {
        uVar11 = count;
      }
      uVar7 = uVar11;
      if (uVar10 != 0) {
        uVar7 = uVar4;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar4 < uVar11) {
            left = ldata->months;
            iVar2 = ldata->micros;
            uVar4 = uVar5;
            do {
              right.micros = uVar4;
              right._0_8_ = iVar2;
              tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)(uint)rdata[uVar7].days,(date_t)left,right);
              result_data[uVar7].value = tVar3.value;
              uVar7 = uVar7 + 1;
            } while (uVar11 != uVar7);
          }
        }
        else if (uVar4 < uVar11) {
          uVar9 = 0;
          uVar7 = uVar5;
          do {
            if ((uVar10 >> (uVar9 & 0x3f) & 1) != 0) {
              left_00 = ldata->months;
              right_00.micros = uVar7;
              right_00._0_8_ = ldata->micros;
              tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)(uint)rdata[uVar4 + uVar9].days,
                                 (date_t)left_00,right_00);
              result_data[uVar4 + uVar9].value = tVar3.value;
            }
            uVar9 = uVar9 + 1;
          } while ((uVar4 - uVar11) + uVar9 != 0);
          uVar7 = uVar4 + uVar9;
        }
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar7;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}